

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O2

bool __thiscall cppurses::Key::Press::filter_send(Press *this,Widget *filter)

{
  int iVar1;
  
  iVar1 = (*filter->_vptr_Widget[0x23])
                    (filter,(this->super_Event).super_Input_event.super_Event.receiver_);
  return SUB41(iVar1,0);
}

Assistant:

bool Key::Press::filter_send(Widget& filter) const {
    return filter.key_press_event_filter(receiver_,
                                         Key::State{key_, key_to_char(key_)});
}